

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pGiaObj,Vec_Int_t *vRoAnds)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGiaObj) && (pGiaObj < pGVar1 + p->nObjs)) {
    iVar2 = (int)((long)pGiaObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar2] == p->nTravIds) {
      return;
    }
    p->pTravIds[iVar2] = p->nTravIds;
    if (((int)(uint)*(undefined8 *)pGiaObj < 0) ||
       (uVar3 = (uint)*(undefined8 *)pGiaObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pGiaObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0xe0,"void Gla_ManCollectInternal_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Gla_ManCollectInternal_rec(p,pGiaObj + -(ulong)uVar3,vRoAnds);
    Gla_ManCollectInternal_rec
              (p,pGiaObj + -(ulong)(*(uint *)&pGiaObj->field_0x4 & 0x1fffffff),vRoAnds);
    pGVar1 = p->pObjs;
    if ((pGVar1 <= pGiaObj) && (pGiaObj < pGVar1 + p->nObjs)) {
      Vec_IntPush(vRoAnds,(int)((ulong)((long)pGiaObj - (long)pGVar1) >> 2) * -0x55555555);
      return;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gla_ManCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pGiaObj, Vec_Int_t * vRoAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pGiaObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pGiaObj);
    assert( Gia_ObjIsAnd(pGiaObj) );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin0(pGiaObj), vRoAnds );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin1(pGiaObj), vRoAnds );
    Vec_IntPush( vRoAnds, Gia_ObjId(p, pGiaObj) );
}